

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O3

string * __thiscall
MetaCommand::GetValueAsString
          (string *__return_storage_ptr__,MetaCommand *this,string *optionName,string *fieldName)

{
  pointer pcVar1;
  size_t __n;
  pointer pFVar2;
  undefined1 *__s2;
  int iVar3;
  pointer pFVar4;
  pointer pOVar5;
  string fieldname;
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  local_58 = local_48;
  pcVar1 = (fieldName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + fieldName->_M_string_length);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_58);
  }
  __s2 = local_58;
  pOVar5 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = (this->m_OptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pOVar5 != local_38) {
    __n = optionName->_M_string_length;
    do {
      if (((pOVar5->name)._M_string_length == __n) &&
         ((__n == 0 ||
          (iVar3 = bcmp((pOVar5->name)._M_dataplus._M_p,(optionName->_M_dataplus)._M_p,__n),
          iVar3 == 0)))) {
        pFVar2 = (pOVar5->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pFVar4 = (pOVar5->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start; pFVar4 != pFVar2;
            pFVar4 = pFVar4 + 1) {
          if (((pFVar4->name)._M_string_length == local_50) &&
             ((local_50 == 0 ||
              (iVar3 = bcmp((pFVar4->name)._M_dataplus._M_p,__s2,local_50), iVar3 == 0)))) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar1 = (pFVar4->value)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar1,
                       pcVar1 + (pFVar4->value)._M_string_length);
            goto LAB_0011933b;
          }
        }
      }
      pOVar5 = pOVar5 + 1;
    } while (pOVar5 != local_38);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0011933b:
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

METAIO_STL::string MetaCommand::GetValueAsString(METAIO_STL::string optionName,
                                          METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return (*itField).value;
          }
        ++itField;
        }
      }
    ++it;
    }
  return "";
}